

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O3

error __thiscall f2f::rounding(f2f *this,context *ctx,token *token,opcode *op)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  string_view prefix;
  optional<unsigned_long> oVar4;
  token local_58;
  
  uVar1 = (uint)op->value;
  if (((uVar1 >> 10 ^ uVar1 >> 8) & 3) != 0) {
    prefix._M_str = ".";
    prefix._M_len = 1;
    oVar4 = find_in_table(token,rounding::table,prefix);
    if (((undefined1  [16])
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
        (undefined1  [16])0x0) {
      uVar3 = 0;
    }
    else {
      context::tokenize(&local_58,ctx);
      token->column = local_58.column;
      (token->data).string._M_str = local_58.data.string._M_str;
      token->type = local_58.type;
      token->line = local_58.line;
      token->filename = local_58.filename;
      (token->data).predicate = local_58.data.predicate;
      uVar3 = oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_payload << 0x27;
    }
    if ((op->value & uVar3) != 0) goto LAB_00123edf;
    uVar3 = op->value | uVar3;
    goto LAB_00123ebf;
  }
  iVar2 = equal(token,".ROUND");
  if (iVar2 == 0) {
    iVar2 = equal(token,".FLOOR");
    if (iVar2 != 0) {
      uVar3 = 0x48000000000;
      goto LAB_00123e8b;
    }
    iVar2 = equal(token,".CEIL");
    if (iVar2 != 0) {
      uVar3 = 0x50000000000;
      goto LAB_00123e8b;
    }
    iVar2 = equal(token,".TRUNC");
    if (iVar2 != 0) {
      uVar3 = 0x58000000000;
      goto LAB_00123e8b;
    }
    iVar2 = equal(token,".PASS");
    if (iVar2 != 0) {
      uVar3 = 0x18000000000;
      goto LAB_00123e8b;
    }
    uVar3 = 0;
  }
  else {
    uVar3 = 0x40000000000;
LAB_00123e8b:
    context::tokenize(&local_58,ctx);
    token->column = local_58.column;
    (token->data).string._M_str = local_58.data.string._M_str;
    token->type = local_58.type;
    token->line = local_58.line;
    token->filename = local_58.filename;
    (token->data).predicate = local_58.data.predicate;
  }
  if ((op->value & uVar3) != 0) {
LAB_00123edf:
    __assert_fail("(value & bits) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/opcode.h"
                  ,0x31,"void opcode::add_bits(uint64_t)");
  }
  uVar3 = op->value | uVar3;
LAB_00123ebf:
  op->value = uVar3;
  *(undefined8 *)this = 0;
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)this;
}

Assistant:

DEFINE_OPERAND(rounding)
    {
        const int dst_format = (op.value >> 8) & 0b11;
        const int src_format = (op.value >> 10) & 0b11;
        if (dst_format == src_format) {
            std::optional<uint64_t> result;
            if (equal(token, ".ROUND")) {
                result = 0b1000;
            } else if (equal(token, ".FLOOR")) {
                result = 0b1001;
            } else if (equal(token, ".CEIL")) {
                result = 0b1010;
            } else if (equal(token, ".TRUNC")) {
                result = 0b1011;
            } else if (equal(token, ".PASS")) {
                result = 0b0011;
            }
            if (result) {
                token = ctx.tokenize();
            }
            op.add_bits(result.value_or(0) << 39);
            return {};
        }

        static const char* table[] = {"RN", "RM", "RP", "RZ", nullptr};
        const std::optional result = find_in_table(token, table, ".");
        if (result) {
            token = ctx.tokenize();
        }
        op.add_bits(result.value_or(0) << 39);
        return {};
    }